

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDebugMarkerTests.cpp
# Opt level: O3

TestCaseGroup * deqp::gles2::Functional::createDebugMarkerTests(Context *context)

{
  TestNode *this;
  TestNode *pTVar1;
  
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,context->m_testCtx,"debug_marker","GL_EXT_debug_marker tests");
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"supported","Is GL_EXT_debug_marker supported");
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02132bb8;
  tcu::TestNode::addChild(this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"random","Random GL_EXT_debug_marker usage");
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02132c08;
  tcu::TestNode::addChild(this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,context->m_testCtx,"invalid","Invalid GL_EXT_debug_marker usage");
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_02132c58;
  tcu::TestNode::addChild(this,pTVar1);
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createDebugMarkerTests (Context& context)
{
	de::MovePtr<tcu::TestCaseGroup>	debugMarkerGroup	(new tcu::TestCaseGroup(context.getTestContext(), "debug_marker", "GL_EXT_debug_marker tests"));

	debugMarkerGroup->addChild(new IsSupportedCase	(context));
	debugMarkerGroup->addChild(new RandomCase		(context));
	debugMarkerGroup->addChild(new InvalidCase		(context));

	return debugMarkerGroup.release();
}